

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

int __thiscall kj::anon_unknown_59::InMemoryFile::stat(InMemoryFile *this,char *__file,stat *__buf)

{
  _func_int **pp_Var1;
  
  kj::_::Mutex::lock((Mutex *)(__file + 0x18),1);
  *(undefined4 *)&(this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode = 0;
  pp_Var1 = *(_func_int ***)(__file + 0x50);
  (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var1;
  *(_func_int ***)&(this->super_AtomicRefcounted).refcount = pp_Var1;
  *(undefined8 *)&(this->impl).mutex = *(undefined8 *)(__file + 0x58);
  *(undefined4 *)&(this->impl).mutex.waitersHead.ptr = 1;
  (this->impl).mutex.waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)__file;
  kj::_::Mutex::unlock((Mutex *)(__file + 0x18),SHARED,(Waiter *)0x0);
  return (int)this;
}

Assistant:

Metadata stat() const override {
    auto lock = impl.lockShared();
    uint64_t hash = reinterpret_cast<uintptr_t>(this);
    return Metadata { Type::FILE, lock->size, lock->size, lock->lastModified, 1, hash };
  }